

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FState * __thiscall
FStateDefinitions::ResolveGotoLabel
          (FStateDefinitions *this,AActor *actor,PClassActor *mytype,char *name)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  PClassActor *this_00;
  char *pcVar4;
  long lVar5;
  int local_88;
  PClass *stype;
  char *classname;
  int v;
  char *pt;
  char *offset;
  char *label;
  char *namestart;
  FState *state;
  PClassActor *type;
  char *name_local;
  PClassActor *mytype_local;
  AActor *actor_local;
  FStateDefinitions *this_local;
  
  pcVar3 = strstr(name,"::");
  state = (FState *)mytype;
  type = (PClassActor *)name;
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    type = (PClassActor *)(pcVar3 + 2);
    iVar2 = strcasecmp(name,"Super");
    if (iVar2 == 0) {
      state = (FState *)dyn_cast<PClassActor>((DObject *)(mytype->super_PClass).ParentClass);
      GetDefaultByType((PClass *)state);
    }
    else {
      this_00 = (PClassActor *)PClass::FindClass(name);
      if (this_00 == (PClassActor *)0x0) {
        I_Error("%s is an unknown class.",name);
      }
      bVar1 = PClass::IsDescendantOf((PClass *)this_00,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        pcVar3 = FName::GetChars(&(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName);
        I_Error("%s is not an actor class, so it has no states.",pcVar3);
      }
      bVar1 = PClass::IsAncestorOf((PClass *)this_00,&mytype->super_PClass);
      if (!bVar1) {
        pcVar3 = FName::GetChars(&(mytype->super_PClass).super_PStruct.super_PNamedType.TypeName);
        pcVar4 = FName::GetChars(&(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName);
        I_Error("%s is not derived from %s so cannot access its states.",pcVar3,pcVar4);
      }
      state = (FState *)mytype;
      if (mytype != this_00) {
        GetDefaultByType((PClass *)this_00);
        state = (FState *)this_00;
      }
    }
  }
  pt = (char *)0x0;
  pcVar3 = strchr((char *)type,0x2b);
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    pt = pcVar3 + 1;
  }
  if (pt == (char *)0x0) {
    local_88 = 0;
  }
  else {
    lVar5 = strtol(pt,(char **)0x0,0);
    local_88 = (int)lVar5;
  }
  if ((PClassActor *)state == mytype) {
    namestart = (char *)FindState(this,(char *)type);
  }
  else {
    namestart = (char *)PClassActor::FindStateByString((PClassActor *)state,(char *)type,true);
  }
  if (namestart == (char *)0x0) {
    if (local_88 == 0) {
      pcVar3 = FName::GetChars((FName *)&state[3].sprite);
      Printf("\x1cGAttempt to get invalid state %s from actor %s.\n",type,pcVar3);
    }
    else {
      pcVar3 = FName::GetChars((FName *)&state[3].sprite);
      I_Error("Attempt to get invalid state %s from actor %s.",type,pcVar3);
    }
  }
  else {
    namestart = namestart + (long)local_88 * 0x28;
  }
  if (name != (char *)0x0) {
    operator_delete__(name);
  }
  return (FState *)namestart;
}

Assistant:

FState *FStateDefinitions::ResolveGotoLabel (AActor *actor, PClassActor *mytype, char *name)
{
	PClassActor *type = mytype;
	FState *state;
	char *namestart = name;
	char *label, *offset, *pt;
	int v;

	// Check for classname
	if ((pt = strstr (name, "::")) != NULL)
	{
		const char *classname = name;
		*pt = '\0';
		name = pt + 2;

		// The classname may either be "Super" to identify this class's immediate
		// superclass, or it may be the name of any class that this one derives from.
		if (stricmp (classname, "Super") == 0)
		{
			type = dyn_cast<PClassActor>(type->ParentClass);
			actor = GetDefaultByType(type);
		}
		else
		{
			// first check whether a state of the desired name exists
			PClass *stype = PClass::FindClass (classname);
			if (stype == NULL)
			{
				I_Error ("%s is an unknown class.", classname);
			}
			if (!stype->IsDescendantOf (RUNTIME_CLASS(AActor)))
			{
				I_Error ("%s is not an actor class, so it has no states.", stype->TypeName.GetChars());
			}
			if (!stype->IsAncestorOf (type))
			{
				I_Error ("%s is not derived from %s so cannot access its states.",
					type->TypeName.GetChars(), stype->TypeName.GetChars());
			}
			if (type != stype)
			{
				type = static_cast<PClassActor *>(stype);
				actor = GetDefaultByType (type);
			}
		}
	}
	label = name;
	// Check for offset
	offset = NULL;
	if ((pt = strchr (name, '+')) != NULL)
	{
		*pt = '\0';
		offset = pt + 1;
	}
	v = offset ? strtol (offset, NULL, 0) : 0;

	// Get the state's address.
	if (type == mytype)
	{
		state = FindState (label);
	}
	else
	{
		state = type->FindStateByString(label, true);
	}

	if (state != NULL)
	{
		state += v;
	}
	else if (v != 0)
	{
		I_Error ("Attempt to get invalid state %s from actor %s.", label, type->TypeName.GetChars());
	}
	else
	{
		Printf (TEXTCOLOR_RED "Attempt to get invalid state %s from actor %s.\n", label, type->TypeName.GetChars());
	}
	delete[] namestart;		// free the allocated string buffer
	return state;
}